

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

bool __thiscall
dg::vr::RelationsAnalyzer::processPhi
          (RelationsAnalyzer *this,ValueRelations *newGraph,VRAssumeBool *assume)

{
  Instruction *ptr;
  bool bVar1;
  VRLocation *pVVar2;
  bool bVar3;
  VRAssumeBool tmp;
  vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> local_58;
  VRAssumeBool local_40;
  
  StructureAnalyzer::possibleSources
            (&local_58,*(StructureAnalyzer **)(this + 0x40),(PHINode *)(assume->super_VRAssume).val,
             assume->assumption);
  bVar3 = true;
  if ((long)local_58.
            super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_58.
            super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>.
            _M_impl.super__Vector_impl_data._M_start == 8) {
    ptr = (Instruction *)
          ((*local_58.
             super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>.
             _M_impl.super__Vector_impl_data._M_start)->op)._M_t.
          super___uniq_ptr_impl<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>._M_t.
          super__Tuple_impl<0UL,_dg::vr::VROp_*,_std::default_delete<dg::vr::VROp>_>.
          super__Head_base<0UL,_dg::vr::VROp_*,_false>._M_head_impl[1]._vptr_VROp;
    if ((ptr != (Instruction *)0x0) && (ptr[0x10] == (Instruction)0x50)) {
      local_40.assumption = assume->assumption;
      local_40.super_VRAssume.super_VROp.type = ASSUME_BOOL;
      local_40.super_VRAssume.super_VROp._vptr_VROp = (_func_int **)&PTR__VROp_00136d00;
      local_40.super_VRAssume.val = (Value *)ptr;
      pVVar2 = VRCodeGraph::getVRLocation(*(VRCodeGraph **)(this + 0x38),ptr);
      bVar1 = processICMP(this,&pVVar2->relations,newGraph,&local_40);
      if (!bVar1) {
        bVar3 = false;
        goto LAB_0011f1a6;
      }
    }
    ValueRelations::merge
              (newGraph,&(*local_58.
                           super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                           ._M_impl.super__Vector_impl_data._M_start)->target->relations,
               (Relations)0xfff);
  }
LAB_0011f1a6:
  if (local_58.super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool RelationsAnalyzer::processPhi(ValueRelations &newGraph,
                                   VRAssumeBool *assume) {
    const llvm::PHINode *phi = llvm::cast<llvm::PHINode>(assume->getValue());
    const auto &sources =
            structure.possibleSources(phi, assume->getAssumption());
    if (sources.size() != 1)
        return true;

    VRInstruction *inst = static_cast<VRInstruction *>(sources[0]->op.get());
    const auto *icmp = llvm::dyn_cast<llvm::ICmpInst>(inst->getInstruction());

    bool result;
    if (icmp) {
        VRAssumeBool tmp{inst->getInstruction(), assume->getAssumption()};
        result = processICMP(codeGraph.getVRLocation(icmp).relations, newGraph,
                             &tmp);
        if (!result)
            return false;
    }

    VRLocation &source = *sources[0]->target;
    result = newGraph.merge(source.relations);
    assert(result);
    return true;
}